

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectsContext.cpp
# Opt level: O2

void __thiscall
ObjectsContext::WriteEncodedHexString
          (ObjectsContext *this,string *inString,ETokenSeparator inSeparate)

{
  bool bVar1;
  ObjectsContext *this_00;
  string local_40;
  
  this_00 = (ObjectsContext *)inString;
  bVar1 = IsEncrypting(this);
  if (bVar1) {
    DecodeHexString(&local_40,this_00,inString);
    WriteHexString(this,&local_40,inSeparate);
    std::__cxx11::string::~string((string *)&local_40);
    return;
  }
  PrimitiveObjectsWriter::WriteEncodedHexString(&this->mPrimitiveWriter,inString,inSeparate);
  return;
}

Assistant:

void ObjectsContext::WriteEncodedHexString(const std::string& inString, ETokenSeparator inSeparate) 
{
	if (IsEncrypting())
	{
		WriteHexString(DecodeHexString(inString), inSeparate);
	}
	else {
		mPrimitiveWriter.WriteEncodedHexString(inString, inSeparate);
	}
}